

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

void __thiscall
Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)7,_true>::ControlPacket
          (ControlPacket<(Protocol::MQTT::Common::ControlPacketType)7,_true> *this)

{
  (this->super_ControlPacketSerializableImpl).header = &(this->header).super_FixedHeaderBase;
  (this->super_ControlPacketSerializableImpl).remLength.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00126958;
  (this->super_ControlPacketSerializableImpl).remLength.size = 1;
  (this->super_ControlPacketSerializableImpl).remLength.field_0.value[0] = '\0';
  (this->super_ControlPacketSerializableImpl).fixedVariableHeader =
       (FixedFieldGeneric *)&this->fixedVariableHeader;
  (this->super_ControlPacketSerializableImpl).props = &(this->props).super_SerializableProperties;
  (this->super_ControlPacketSerializableImpl).payload = &this->payload;
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_001282a8;
  (this->header).super_FixedHeaderBase.typeAndFlags = 'p';
  (this->header).super_FixedHeaderBase._vptr_FixedHeaderBase = (_func_int **)&PTR_getType_00128300;
  *(undefined2 *)
   &(this->fixedVariableHeader).super_FixedFieldWithIDAndReason.super_FixedFieldWithRemainingLength.
    field_0x14 = 0;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason.super_FixedFieldWithRemainingLength.
  field_0x16 = 0;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason.super_FixedFieldWithRemainingLength.
  super_FixedFieldGeneric.value =
       &(this->fixedVariableHeader).super_FixedFieldWithIDAndReason._v.super_GenericTypeBase;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason.super_FixedFieldWithRemainingLength.
  remLength = 3;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason.super_FixedFieldWithRemainingLength.
  super_FixedFieldGeneric.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00127fd8;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason._v.super_GenericTypeBase.
  _vptr_GenericTypeBase = (_func_int **)&PTR_typeSize_00128068;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason._v.value =
       (IDAndReason *)
       &(this->fixedVariableHeader).super_FixedFieldWithIDAndReason.
        super_FixedFieldWithRemainingLength.field_0x14;
  (this->fixedVariableHeader).super_FixedFieldWithIDAndReason.super_FixedFieldWithRemainingLength.
  super_FixedFieldGeneric.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00128348;
  (this->props).super_SerializableProperties.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00127c50;
  (this->props).length.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_00126958;
  (this->props).length.size = 1;
  (this->props).length.field_0.value[0] = '\0';
  (this->props).buffer = (uint8 *)0x0;
  (this->payload).super_EmptySerializable.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00127a48;
  return;
}

Assistant:

ControlPacket() : ControlPacketSerializableImpl(header, fixedVariableHeader, props, payload)
                {
                    payload.setFlags(fixedVariableHeader); fixedVariableHeader.setFlags(header.typeAndFlags);
                }